

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int launch_obj(short otyp,int x1,int y1,int x2,int y2,int style)

{
  char cVar1;
  trap *ptVar2;
  bool bVar3;
  int iVar4;
  boolean bVar5;
  schar sVar6;
  int iVar7;
  int iVar8;
  obj *poVar9;
  obj *poVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  trap *ptVar11;
  trap *ptVar12;
  uint uVar13;
  int iVar14;
  monst *mtmp;
  ulong uVar15;
  undefined6 in_register_0000003a;
  char *pcVar16;
  ulong uVar17;
  int iVar18;
  trap *__ptr;
  bool bVar19;
  obj *singleobj;
  d_level dest;
  obj *local_68;
  int local_5c;
  int local_58;
  d_level local_52;
  int local_50;
  uint local_4c;
  undefined8 local_48;
  undefined8 local_40;
  obj *local_38;
  
  iVar8 = (int)CONCAT62(in_register_0000003a,otyp);
  local_50 = y2;
  poVar9 = sobj_at(0x214,level,iVar8,x1);
  poVar10 = poVar9;
  if (poVar9 == (obj *)0x0) {
    poVar10 = sobj_at(0x214,level,y1,x2);
  }
  if (poVar10 == (obj *)0x0) {
    return 0;
  }
  iVar14 = x2;
  iVar18 = y1;
  local_5c = iVar8;
  local_58 = x1;
  if (poVar9 != (obj *)0x0) {
    iVar14 = x1;
    iVar18 = iVar8;
    local_5c = y1;
    local_58 = x2;
  }
  if (poVar10->quan == 1) {
    obj_extract_self(poVar10);
    local_38 = (obj *)0x0;
    local_68 = poVar10;
  }
  else {
    local_68 = splitobj(poVar10,1);
    obj_extract_self(local_68);
    local_38 = poVar10;
  }
  newsym(iVar18,iVar14);
  iVar4 = local_58;
  iVar8 = local_5c;
  if ((local_68->ox == digging.pos.x) && (local_68->oy == digging.pos.y)) {
    digging.effort = 0;
    digging.lastdigtime = 0;
    digging.level.dnum = '\0';
    digging.level.dlevel = '\0';
    digging.pos.x = '\0';
    digging.pos.y = '\0';
    digging.down = '\0';
    digging.chew = '\0';
    digging.warned = '\0';
    digging.quiet = '\0';
  }
  iVar7 = distmin(iVar18,iVar14,local_5c,local_58);
  bhitpos.x = (xchar)iVar18;
  bhitpos.y = (xchar)iVar14;
  iVar8 = sgn(iVar8 - iVar18);
  local_48 = CONCAT44(extraout_var,iVar8);
  iVar8 = sgn(iVar4 - iVar14);
  local_40 = CONCAT44(extraout_var_00,iVar8);
  if (local_50 != 1) {
    if (local_50 == 0x81) {
      *(uint *)&local_68->field_0x4a = *(uint *)&local_68->field_0x4a | 0x8000;
    }
    else {
      local_4c = 1;
      if (local_50 != 0x41) goto LAB_00267c24;
      pcVar16 = "rumbling in the distance.";
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum == u.umonster) {
          pcVar16 = "someone bowling.";
        }
        else {
          bVar5 = dmgtype(youmonst.data,0x24);
          pcVar16 = "rumbling in the distance.";
          if (bVar5 == '\0') {
            pcVar16 = "someone bowling.";
          }
        }
      }
      You_hear(pcVar16);
    }
  }
  local_4c = 2;
  local_50 = 1;
LAB_00267c24:
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    flush_screen();
  }
  if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
     ((u.umonnum != u.umonster && (bVar5 = dmgtype(youmonst.data,0x24), bVar5 != '\0')))) {
    iVar8 = (int)local_68->otyp;
  }
  else {
    iVar8 = display_rng(0x219);
    iVar8 = iVar8 + 1;
  }
  tmp_at(-4,iVar8 + 1);
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  local_4c = local_4c + 1;
  bVar19 = false;
  do {
    if ((iVar7 < 1) || (bVar19)) break;
    tmp_at((int)bhitpos.x,(int)bhitpos.y);
    uVar13 = local_4c;
    if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
      do {
        (*windowprocs.win_delay)();
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
    }
    bhitpos.x = bhitpos.x + (char)local_48;
    bhitpos.y = bhitpos.y + (char)local_40;
    for (__ptr = level->lev_traps; __ptr != (trap *)0x0; __ptr = __ptr->ntrap) {
      if ((__ptr->tx == bhitpos.x) && (__ptr->ty == bhitpos.y)) goto LAB_00267d56;
    }
    __ptr = (trap *)0x0;
LAB_00267d56:
    mtmp = level->monsters[bhitpos.x][bhitpos.y];
    if (mtmp == (monst *)0x0) {
      mtmp = (monst *)0x0;
    }
    else if ((mtmp->field_0x61 & 2) != 0) {
      mtmp = (monst *)0x0;
    }
    iVar7 = iVar7 + -1;
    if (mtmp == (monst *)0x0) {
      if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
        if (multi != 0) {
          nomul(0,(char *)0x0);
        }
        cVar1 = local_68->spe;
        iVar8 = dmgval((monst *)0x0,local_68,'\x01',&youmonst);
        iVar8 = thitu(cVar1 + 9,iVar8,local_68,(obj *)0x0,(monst *)0x0,(char *)0x0);
        if (iVar8 != 0) {
          stop_occupation();
        }
      }
LAB_00267e83:
      if (local_50 == 1) {
        sVar6 = down_gate(bhitpos.x,bhitpos.y);
        if ((sVar6 != -1) && (bVar5 = ship_object(local_68,bhitpos.x,bhitpos.y,'\0'), bVar5 != '\0')
           ) goto LAB_00267f40;
        if (__ptr == (trap *)0x0) {
LAB_00267f20:
          bVar5 = flooreffects(local_68,(int)bhitpos.x,(int)bhitpos.y,"fall");
          if (bVar5 != '\0') goto LAB_00267f40;
          poVar10 = sobj_at(0x214,level,(int)bhitpos.x,(int)bhitpos.y);
          if (poVar10 == (obj *)0x0) goto LAB_0026809b;
          iVar8 = (int)bhitpos.x;
          if (((int)local_48 + iVar8) - 1U < 0x4f) {
            uVar13 = bhitpos.y + (int)local_40;
            if (((((int)uVar13 < 0) || (0x14 < (int)uVar13)) || (iVar7 == 0)) ||
               (pcVar16 = " as one boulder sets another in motion",
               level->locations[(uint)((int)local_48 + iVar8)][uVar13].typ < '\x11'))
            goto LAB_00268006;
          }
          else {
LAB_00268006:
            pcVar16 = " as one boulder hits another";
          }
          if ((viz_array[bhitpos.y][iVar8] & 2U) == 0) {
            pcVar16 = "";
          }
          You_hear("a loud crash%s!",pcVar16);
          obj_extract_self(poVar10);
          *(uint *)&poVar10->field_0x4a =
               *(uint *)&poVar10->field_0x4a & 0xffff7fff | *(uint *)&local_68->field_0x4a & 0x8000;
          local_68->field_0x4b = local_68->field_0x4b & 0x7f;
          place_object(local_68,level,(int)bhitpos.x,(int)bhitpos.y);
          local_68 = poVar10;
          wake_nearto((int)bhitpos.x,(int)bhitpos.y,100);
          goto LAB_0026809b;
        }
        uVar13 = (byte)__ptr->field_0x8 & 0x1f;
        if (uVar13 - 0xb < 4) {
          local_5c = (int)bhitpos.x;
          local_58 = (int)bhitpos.y;
          bVar5 = flooreffects(local_68,local_5c,local_58,"fall");
          bVar19 = bVar5 != '\0';
          iVar7 = -1;
          goto LAB_00267f0b;
        }
        if (1 < uVar13 - 0x10) {
          if ((uVar13 == 6) && (uVar13 = mt_random(), 2 < uVar13 % 10)) {
            pcVar16 = " The rolling boulder triggers a land mine.";
            if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
              pcVar16 = "";
            }
            pline("KAABLAMM!!!%s",pcVar16);
            ptVar2 = level->lev_traps;
            if (ptVar2 == __ptr) {
              ptVar11 = (trap *)&level->lev_traps;
              ptVar12 = ptVar2;
            }
            else {
              do {
                ptVar11 = ptVar2;
                ptVar12 = __ptr;
                ptVar2 = ptVar11->ntrap;
              } while (ptVar11->ntrap != __ptr);
            }
            ptVar11->ntrap = ptVar12->ntrap;
            free(__ptr);
            del_engr_at(level,(int)bhitpos.x,(int)bhitpos.y);
            place_object(local_68,level,(int)bhitpos.x,(int)bhitpos.y);
            *(uint *)&local_68->field_0x4a = *(uint *)&local_68->field_0x4a & 0xffff7fff;
            fracture_rock(local_68);
            scatter((int)bhitpos.x,(int)bhitpos.y,4,0x1f,(obj *)0x0);
            uVar15 = (ulong)bhitpos.y;
            uVar17 = (ulong)bhitpos.x;
            bVar19 = true;
            if ((viz_array[uVar15][uVar17] & 2U) != 0) goto LAB_002683c9;
          }
LAB_00267f0b:
          bVar3 = true;
          if ((bVar19) || (iVar7 == -1)) goto LAB_002682f6;
          goto LAB_00267f20;
        }
        if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
          You_hear("a rumbling stop abruptly.");
        }
        else {
          pline("Suddenly the rolling boulder disappears!");
        }
        *(uint *)&local_68->field_0x4a = *(uint *)&local_68->field_0x4a & 0xffff7fff;
        if ((__ptr->field_0x8 & 0x1f) == 0x10) {
          rloco(local_68);
LAB_0026829c:
          bVar19 = true;
          if ((__ptr->field_0x8 & 0x20) == 0) {
            __ptr->field_0x8 = __ptr->field_0x8 | 0x20;
            uVar17 = (ulong)(uint)(int)__ptr->tx;
            uVar15 = (ulong)(uint)(int)__ptr->ty;
LAB_002683c9:
            bVar19 = true;
            newsym((int)uVar17,(int)uVar15);
          }
          goto LAB_00267f0b;
        }
        iVar8 = random_teleport_level();
        sVar6 = depth(&u.uz);
        if ((iVar8 != sVar6) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
          get_level(&local_52,iVar8);
          deliver_object(local_68,local_52.dnum,local_52.dlevel,0);
          goto LAB_0026829c;
        }
      }
      else {
LAB_0026809b:
        bVar5 = closed_door(level,(int)bhitpos.x,(int)bhitpos.y);
        if (bVar5 != '\0') {
          if ((viz_array[bhitpos.y][bhitpos.x] & 2U) != 0) {
            pline("The boulder crashes through a door.");
          }
          *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 =
               *(uint *)&level->locations[bhitpos.x][bhitpos.y].field_0x6 & 0xfffffe0f | 0x10;
          if (iVar7 != 0) {
            unblock_point((int)bhitpos.x,(int)bhitpos.y);
          }
        }
        if (0 < iVar7) {
          iVar8 = (int)bhitpos.x;
          if (((int)local_48 + iVar8) - 1U < 0x4f) {
            iVar14 = (int)bhitpos.y;
            uVar13 = (int)local_40 + iVar14;
            if ((uVar13 < 0x15) &&
               (level->locations[(uint)((int)local_48 + iVar8)][uVar13].typ == '\x16')) {
              uVar13 = mt_random();
              bVar5 = hits_bars(&local_68,iVar8,iVar14,(int)local_48,(int)local_40,
                                (uint)((uVar13 * -0x33333333 >> 2 | uVar13 * 0x40000000) < 0xccccccd
                                      ),0);
              local_5c = iVar8;
              local_58 = iVar14;
              if (bVar5 == '\0') {
                bVar3 = false;
              }
              else {
                if (local_68 == (obj *)0x0) {
                  bVar19 = true;
                }
                bVar3 = true;
              }
              goto LAB_002682f6;
            }
          }
        }
      }
      bVar3 = false;
    }
    else if (((mtmp->data->mflags2 & 0x8000000) == 0) ||
            (uVar13 = mt_random(), uVar13 * -0x55555555 < 0x55555556)) {
      iVar8 = iVar7;
      if (local_50 == 1) {
        iVar8 = -1;
      }
      iVar8 = ohitmon((monst *)0x0,mtmp,local_68,local_38,iVar8,'\0');
      if (iVar8 == 0) goto LAB_00267e83;
LAB_00267f40:
      bVar3 = true;
      bVar19 = true;
    }
    else {
      pcVar16 = Monnam(mtmp);
      pline("%s snatches the boulder.",pcVar16);
      *(uint *)&local_68->field_0x4a = *(uint *)&local_68->field_0x4a & 0xffff7fff;
      mpickobj(mtmp,local_68);
      bVar19 = true;
      bVar3 = true;
    }
LAB_002682f6:
  } while (!bVar3);
  tmp_at(-6,0);
  iVar14 = local_58;
  iVar8 = local_5c;
  iVar18 = 2;
  if (!bVar19) {
    *(uint *)&local_68->field_0x4a = *(uint *)&local_68->field_0x4a & 0xffff7fff;
    place_object(local_68,level,local_5c,local_58);
    newsym(iVar8,iVar14);
    iVar18 = 1;
  }
  return iVar18;
}

Assistant:

int launch_obj(short otyp, int x1, int y1, int x2, int y2, int style)
{
	struct monst *mtmp;
	struct obj *otmp, *otmp2;
	int dx, dy;
	struct obj *singleobj, *ostack;
	boolean used_up = FALSE;
	boolean otherside = FALSE;
	int dist;
	int tmp;
	int delaycnt = 0;

	otmp = sobj_at(otyp, level, x1, y1);
	/* Try the other side too, for rolling boulder traps */
	if (!otmp && otyp == BOULDER) {
		otherside = TRUE;
		otmp = sobj_at(otyp, level, x2, y2);
	}
	if (!otmp) return 0;
	if (otherside) {	/* swap 'em */
		int tx, ty;

		tx = x1; ty = y1;
		x1 = x2; y1 = y2;
		x2 = tx; y2 = ty;
	}

	if (otmp->quan == 1L) {
	    ostack = NULL;
	    obj_extract_self(otmp);
	    singleobj = otmp;
	    otmp = NULL;
	} else {
	    ostack = otmp;
	    singleobj = splitobj(otmp, 1L);
	    obj_extract_self(singleobj);
	}
	newsym(x1,y1);
	/* in case you're using a pick-axe to chop the boulder that's being
	   launched (perhaps a monster triggered it), destroy context so that
	   next dig attempt never thinks you're resuming previous effort */
	if ((otyp == BOULDER || otyp == STATUE) &&
	    singleobj->ox == digging.pos.x && singleobj->oy == digging.pos.y)
	    memset(&digging, 0, sizeof digging);

	dist = distmin(x1,y1,x2,y2);
	bhitpos.x = x1;
	bhitpos.y = y1;
	dx = sgn(x2 - x1);
	dy = sgn(y2 - y1);
	switch (style) {
	    case ROLL|LAUNCH_UNSEEN:
			if (otyp == BOULDER) {
			    You_hear(Hallucination ?
				     "someone bowling." :
				     "rumbling in the distance.");
			}
			style &= ~LAUNCH_UNSEEN;
			goto roll;
	    case ROLL|LAUNCH_KNOWN:
			/* use otrapped as a flag to ohitmon */
			singleobj->otrapped = 1;
			style &= ~LAUNCH_KNOWN;
			/* fall through */
	    roll:
	    case ROLL:
			delaycnt = 2;
			/* fall through */
	    default:
			if (!delaycnt)
			    delaycnt = 1;
			if (!cansee(bhitpos.x,bhitpos.y))
			    flush_screen();
			
			tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
			tmp_at(bhitpos.x, bhitpos.y);
	}

	/* Set the object in motion */
	while (dist-- > 0 && !used_up) {
		struct trap *t;
		tmp_at(bhitpos.x, bhitpos.y);
		tmp = delaycnt;

		/* dstage@u.washington.edu -- Delay only if hero sees it */
		if (cansee(bhitpos.x, bhitpos.y))
			while (tmp-- > 0) win_delay_output();

		bhitpos.x += dx;
		bhitpos.y += dy;
		t = t_at(level, bhitpos.x, bhitpos.y);
		
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
			if (otyp == BOULDER && throws_rocks(mtmp->data)) {
			    if (rn2(3)) {
				pline("%s snatches the boulder.",
					Monnam(mtmp));
				singleobj->otrapped = 0;
				mpickobj(mtmp, singleobj);
				used_up = TRUE;
				break;
			    }
			}
			if (ohitmon(NULL, mtmp, singleobj, ostack,
					(style==ROLL) ? -1 : dist, FALSE)) {
				used_up = TRUE;
				break;
			}
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
			if (multi) nomul(0, NULL);
			if (thitu(9 + singleobj->spe,
				  dmgval(NULL, singleobj, TRUE, &youmonst),
				  singleobj, NULL, NULL, NULL)) {
			    stop_occupation();
			}
		}
		if (style == ROLL) {
		    if (down_gate(bhitpos.x, bhitpos.y) != -1) {
		        if (ship_object(singleobj, bhitpos.x, bhitpos.y, FALSE)){
				used_up = TRUE;
				break;
			}
		    }
		    if (t && otyp == BOULDER) {
			switch(t->ttyp) {
			case LANDMINE:
			    if (rn2(10) > 2) {
			  	pline(
				  "KAABLAMM!!!%s",
				  cansee(bhitpos.x, bhitpos.y) ?
					" The rolling boulder triggers a land mine." : "");
				deltrap(level, t);
				del_engr_at(level, bhitpos.x,bhitpos.y);
				place_object(singleobj, level, bhitpos.x, bhitpos.y);
				singleobj->otrapped = 0;
				fracture_rock(singleobj);
				scatter(bhitpos.x,bhitpos.y, 4,
					MAY_DESTROY|MAY_HIT|MAY_FRACTURE|VIS_EFFECTS,
					NULL);
				if (cansee(bhitpos.x,bhitpos.y))
					newsym(bhitpos.x,bhitpos.y);
			        used_up = TRUE;
			    }
			    break;		
			case LEVEL_TELEP:
			case TELEP_TRAP:
			    if (cansee(bhitpos.x, bhitpos.y))
			    	pline("Suddenly the rolling boulder disappears!");
			    else
			    	You_hear("a rumbling stop abruptly.");
			    singleobj->otrapped = 0;
			    if (t->ttyp == TELEP_TRAP)
				rloco(singleobj);
			    else {
				int newlev = random_teleport_level();
				d_level dest;

				if (newlev == depth(&u.uz) || In_endgame(&u.uz))
				    continue;
				get_level(&dest, newlev);
				deliver_object(singleobj, dest.dnum, dest.dlevel,
					       MIGR_RANDOM);
			    }
			    seetrap(t);
			    used_up = TRUE;
			    break;
			case PIT:
			case SPIKED_PIT:
			case HOLE:
			case TRAPDOOR:
			    /* the boulder won't be used up if there is a
			       monster in the trap; stop rolling anyway */
			    x2 = bhitpos.x,  y2 = bhitpos.y;  /* stops here */
			    if (flooreffects(singleobj, x2, y2, "fall"))
				used_up = TRUE;
			    dist = -1;	/* stop rolling immediately */
			    break;
			}
			if (used_up || dist == -1) break;
		    }
		    if (flooreffects(singleobj, bhitpos.x, bhitpos.y, "fall")) {
			used_up = TRUE;
			break;
		    }
		    if (otyp == BOULDER &&
		       (otmp2 = sobj_at(BOULDER, level, bhitpos.x, bhitpos.y)) != 0) {
			const char *bmsg =
				     " as one boulder sets another in motion";

			if (!isok(bhitpos.x + dx, bhitpos.y + dy) || !dist ||
			    IS_ROCK(level->locations[bhitpos.x + dx][bhitpos.y + dy].typ))
			    bmsg = " as one boulder hits another";

			You_hear("a loud crash%s!",
				cansee(bhitpos.x, bhitpos.y) ? bmsg : "");
			obj_extract_self(otmp2);
			/* pass off the otrapped flag to the next boulder */
			otmp2->otrapped = singleobj->otrapped;
			singleobj->otrapped = 0;
			place_object(singleobj, level, bhitpos.x, bhitpos.y);
			singleobj = otmp2;
			otmp2 = NULL;
			wake_nearto(bhitpos.x, bhitpos.y, 10*10);
		    }
		}
		if (otyp == BOULDER && closed_door(level, bhitpos.x,bhitpos.y)) {
			if (cansee(bhitpos.x, bhitpos.y))
				pline("The boulder crashes through a door.");
			level->locations[bhitpos.x][bhitpos.y].doormask = D_BROKEN;
			if (dist) unblock_point(bhitpos.x, bhitpos.y);
		}

		/* if about to hit iron bars, do so now */
		if (dist > 0 && isok(bhitpos.x + dx,bhitpos.y + dy) &&
			level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS) {
		    x2 = bhitpos.x,  y2 = bhitpos.y;	/* object stops here */
		    if (hits_bars(&singleobj, x2, y2, dx, dy, !rn2(20), 0)) {
			if (!singleobj) used_up = TRUE;
			break;
		    }
		}
	}
	tmp_at(DISP_END, 0);
	if (!used_up) {
		singleobj->otrapped = 0;
		place_object(singleobj, level, x2,y2);
		newsym(x2,y2);
		return 1;
	} else
		return 2;
}